

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::TestSuite::AddTestInfo(TestSuite *this,TestInfo *test_info)

{
  vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *in_RSI;
  value_type_conflict *in_RDI;
  vector<int,_std::allocator<int>_> *this_00;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::push_back
            (in_RSI,(value_type *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  this_00 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x12);
  std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)(in_RDI + 0x12))
  ;
  std::vector<int,_std::allocator<int>_>::push_back(this_00,in_RDI);
  return;
}

Assistant:

void TestSuite::AddTestInfo(TestInfo* test_info) {
  test_info_list_.push_back(test_info);
  test_indices_.push_back(static_cast<int>(test_indices_.size()));
}